

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O0

bool __thiscall trivialre::MatchSubstring(trivialre *this,Matcher *m,string_view str)

{
  basic_string_view<char,_std::char_traits<char>_> __args;
  bool bVar1;
  const_reference pvVar2;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  undefined4 local_88;
  Matcher *local_78;
  size_t sStack_70;
  _Invoker_type local_60;
  size_t i;
  undefined1 local_50 [6];
  bool line_start;
  CB succeed;
  size_t sz;
  Matcher *m_local;
  string_view str_local;
  
  str_local._M_len = str._M_len;
  m_local = m;
  succeed._M_invoker =
       (_Invoker_type)
       std::basic_string_view<char,_std::char_traits<char>_>::size
                 ((basic_string_view<char,_std::char_traits<char>_> *)&m_local);
  std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>::
  function<trivialre::MatchSubstring(std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>const&,std::basic_string_view<char,std::char_traits<char>>)::_lambda(std::basic_string_view<char,std::char_traits<char>>,bool)_1_,void>
            ((function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)> *)local_50,
             (anon_class_1_0_00000001 *)((long)&i + 7));
  i._6_1_ = 1;
  local_60 = (_Invoker_type)0x0;
  do {
    if (succeed._M_invoker <= local_60) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"");
      str_local._M_str._7_1_ =
           std::
           function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
           ::operator()((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                         *)this,local_98,(bool)(i._6_1_ & 1),
                        (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                         *)local_50);
LAB_001132b4:
      local_88 = 1;
      std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>::~function
                ((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)> *)
                 local_50);
      return (bool)(str_local._M_str._7_1_ & 1);
    }
    local_78 = m_local;
    sStack_70 = str_local._M_len;
    __args._M_str = (char *)str_local._M_len;
    __args._M_len = (size_t)m_local;
    bVar1 = std::
            function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
            ::operator()((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                          *)this,__args,(bool)(i._6_1_ & 1),
                         (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                          *)local_50);
    if (bVar1) {
      str_local._M_str._7_1_ = true;
      goto LAB_001132b4;
    }
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&m_local,0);
    i._6_1_ = *pvVar2 == '\n';
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&m_local,1);
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

inline bool MatchSubstring(const Matcher& m, std::string_view str) {
  size_t sz = str.size();
  CB succeed = [](std::string_view str, bool line_start) { return true; };
  bool line_start = true;
  for (size_t i = 0; i < sz; i++) {
    if (m(str, line_start, succeed)) {
      return true;
    }
    line_start = (str[0] == '\n');
    str.remove_prefix(1);
  }
  return m("", line_start, succeed);
}